

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::WATParser::TableType> *
wasm::WATParser::tabletypeContinued<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::WATParser::TableType> *__return_storage_ptr__,ParseDeclsCtx *ctx,
          Type addressType)

{
  _Storage<unsigned_long,_true> _Var1;
  _Copy_ctor_base<false,_wasm::WATParser::Limits,_wasm::Err> *p_Var2;
  string local_c0 [32];
  undefined1 auStack_a0 [8];
  Result<wasm::WATParser::Limits> limits;
  Result<wasm::Ok> type;
  Result<wasm::Ok> _val_1;
  
  if (addressType.id == 2) {
    limits32<wasm::WATParser::ParseDeclsCtx>((Result<wasm::WATParser::Limits> *)auStack_a0,ctx);
  }
  else {
    limits64<wasm::WATParser::ParseDeclsCtx>((Result<wasm::WATParser::Limits> *)auStack_a0,ctx);
  }
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Limits,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Limits,_wasm::Err> *)
                  ((long)&limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err> + 0x20),
                  (_Copy_ctor_base<false,_wasm::WATParser::Limits,_wasm::Err> *)auStack_a0);
  if (type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)
               ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
               (string *)
               ((long)&limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::TableType,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::WATParser::TableType,wasm::Err> *)
               __return_storage_ptr__,
               (__index_type *)
               ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Limits,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Limits,_wasm::Err> *)
                      ((long)&limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err> + 0x20));
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Limits,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Limits,_wasm::Err> *)
                      ((long)&limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err> + 0x20));
    reftype<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::Ok> *)
               ((long)&limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err> + 0x20),ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
               ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
               ((long)&limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err> + 0x20));
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                (local_c0,(string *)
                          ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::WATParser::TableType,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::WATParser::TableType,wasm::Err> *)
                 __return_storage_ptr__,local_c0);
      std::__cxx11::string::~string(local_c0);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      p_Var2 = (_Copy_ctor_base<false,_wasm::WATParser::Limits,_wasm::Err> *)0x0;
      if (limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>._M_u._24_1_ == '\0') {
        p_Var2 = (_Copy_ctor_base<false,_wasm::WATParser::Limits,_wasm::Err> *)auStack_a0;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x18) =
           *(undefined8 *)
            ((long)&(p_Var2->super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>)._M_u.
                    _M_first._M_storage.max.super__Optional_base<unsigned_long,_true,_true>.
                    _M_payload.super__Optional_payload_base<unsigned_long> + 8);
      _Var1 = (p_Var2->super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>)._M_u.
              _M_first._M_storage.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_payload;
      *(uint64_t *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 8) =
           (p_Var2->super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err>)._M_u._M_first.
           _M_storage.initial;
      *(_Storage<unsigned_long,_true> *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x10) = _Var1;
      *(uintptr_t *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> = addressType.id;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
               ((long)&limits.val.super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err> + 0x20));
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Limits,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Limits,_wasm::Err> *)auStack_a0);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TableTypeT> tabletypeContinued(Ctx& ctx,
                                                    Type addressType) {
  auto limits = addressType == Type::i32 ? limits32(ctx) : limits64(ctx);
  CHECK_ERR(limits);
  auto type = reftype(ctx);
  CHECK_ERR(type);
  return ctx.makeTableType(addressType, *limits, *type);
}